

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::ListDatatypeValidator::getCanonicalRepresentation
          (ListDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  short *psVar1;
  int iVar2;
  BaseRefVectorOf<char16_t> *tokenVector;
  undefined4 extraout_var;
  char16_t *pcVar3;
  XMLCh *src;
  XMLCh *__dest;
  undefined7 in_register_00000009;
  long lVar4;
  XMLSize_t getAt;
  XMLCh *target;
  long lVar5;
  XMLCh *local_60;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = (this->super_AbstractStringValidator).super_DatatypeValidator.fMemoryManager;
  }
  this->fContent = rawData;
  tokenVector = XMLString::tokenizeString(rawData,memMgr);
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    checkContent(this,tokenVector,rawData,(ValidationContext *)0x0,false,memMgr);
  }
  lVar4 = 0;
  if (rawData != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)rawData + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    lVar4 = (lVar4 >> 1) + -1;
  }
  iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr);
  target = (XMLCh *)CONCAT44(extraout_var,iVar2);
  lVar4 = lVar4 * 2;
  *target = L'\0';
  do {
    this = (ListDatatypeValidator *)
           (this->super_AbstractStringValidator).super_DatatypeValidator.fBaseValidator;
  } while ((this->super_AbstractStringValidator).super_DatatypeValidator.fType == List);
  local_60 = target;
  if (tokenVector->fCurCount != 0) {
    getAt = 0;
    do {
      pcVar3 = BaseRefVectorOf<char16_t>::elementAt(tokenVector,getAt);
      iVar2 = (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
                _vptr_XSerializable[7])(this,pcVar3,memMgr,0);
      src = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
      lVar5 = 0;
      if (src != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)src + lVar5);
          lVar5 = lVar5 + 2;
        } while (*psVar1 != 0);
        lVar5 = (lVar5 >> 1) + -1;
      }
      if (local_60 + lVar4 <= target + lVar5 + 2) {
        iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,lVar4 * 8);
        __dest = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
        memcpy(__dest,local_60,lVar4 * 2);
        (*memMgr->_vptr_MemoryManager[4])(memMgr,local_60);
        target = (XMLCh *)(((long)target - (long)local_60) + (long)__dest);
        lVar4 = lVar4 << 2;
        local_60 = __dest;
      }
      XMLString::catString(target,src);
      (target + lVar5)[0] = L' ';
      (target + lVar5)[1] = L'\0';
      (*memMgr->_vptr_MemoryManager[4])(memMgr,src);
      target = target + lVar5 + 1;
      getAt = (XMLSize_t)((int)getAt + 1);
    } while (getAt < tokenVector->fCurCount);
  }
  if (tokenVector != (BaseRefVectorOf<char16_t> *)0x0) {
    (*tokenVector->_vptr_BaseRefVectorOf[1])(tokenVector);
  }
  return local_60;
}

Assistant:

const XMLCh* ListDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                             ,       MemoryManager* const memMgr
                                                             ,       bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : getMemoryManager();
    ListDatatypeValidator* temp = (ListDatatypeValidator*) this;
    temp->setContent(rawData);
    BaseRefVectorOf<XMLCh>* tokenVector = XMLString::tokenizeString(rawData, toUse);
    Janitor<BaseRefVectorOf<XMLCh> > janName(tokenVector);    

    if (toValidate)
    {
        try
        {
            temp->checkContent(tokenVector, rawData, 0, false, toUse);
        }
        catch (...)
        {
            return 0;
        }
    }
   
    XMLSize_t retBufSize = 2 * XMLString::stringLen(rawData);
    XMLCh* retBuf = (XMLCh*) toUse->allocate(retBufSize * sizeof(XMLCh));
    retBuf[0] = 0;
    XMLCh* retBufPtr = retBuf;
    DatatypeValidator* itemDv = this->getItemTypeDTV();

    try 
    {
        for (unsigned int i = 0; i < tokenVector->size(); i++)
        {
            XMLCh* itemCanRep = (XMLCh*) itemDv->getCanonicalRepresentation(tokenVector->elementAt(i), toUse, false);
            XMLSize_t itemLen = XMLString::stringLen(itemCanRep); 

            if(retBufPtr+itemLen+2 >= retBuf+retBufSize)
            {
                // need to resize
                XMLCh * oldBuf = retBuf;
                retBuf = (XMLCh*) toUse->allocate(retBufSize * sizeof(XMLCh) * 4);
                memcpy(retBuf, oldBuf, retBufSize * sizeof(XMLCh ));
                retBufPtr = (retBufPtr - oldBuf) + retBuf;
                toUse->deallocate(oldBuf);
                retBufSize <<= 2;
            }

            XMLString::catString(retBufPtr, itemCanRep);
            retBufPtr = retBufPtr + itemLen;
            *(retBufPtr++) = chSpace;
            *(retBufPtr) = chNull;
            toUse->deallocate(itemCanRep);
        }

        return retBuf;

    }
    catch (...)
    {
        return 0;
    }
}